

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::seekValueGenericJoin
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel,bool firstFactor)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  CppGenerator *pCVar13;
  ulong *puVar14;
  undefined8 uVar15;
  ulong uVar16;
  string resetMaxVal;
  string depthString;
  string findUpperBound;
  string upperPointer;
  ulong *local_9f0;
  long local_9e8;
  ulong local_9e0;
  long lStack_9d8;
  ulong *local_9d0;
  long local_9c8;
  ulong local_9c0;
  long lStack_9b8;
  long *local_9b0;
  long local_9a8;
  long local_9a0;
  long lStack_998;
  ulong *local_990;
  long local_988;
  ulong local_980;
  long lStack_978;
  ulong *local_970;
  long local_968;
  ulong local_960;
  long lStack_958;
  ulong *local_950;
  long local_948;
  ulong local_940;
  long lStack_938;
  ulong *local_930;
  long local_928;
  ulong local_920;
  long lStack_918;
  long *local_910;
  long local_908;
  long local_900;
  long lStack_8f8;
  ulong *local_8f0;
  long local_8e8;
  ulong local_8e0;
  long lStack_8d8;
  ulong *local_8d0;
  long local_8c8;
  ulong local_8c0;
  long lStack_8b8;
  ulong *local_8b0;
  long local_8a8;
  ulong local_8a0;
  long lStack_898;
  long *local_890;
  long local_888;
  long local_880;
  long lStack_878;
  ulong *local_870;
  long local_868;
  ulong local_860;
  long lStack_858;
  ulong *local_850;
  long local_848;
  ulong local_840;
  long lStack_838;
  ulong *local_830;
  long local_828;
  ulong local_820;
  long lStack_818;
  ulong *local_810;
  long local_808;
  ulong local_800;
  long lStack_7f8;
  ulong *local_7f0;
  long local_7e8;
  ulong local_7e0;
  long lStack_7d8;
  ulong *local_7d0;
  long local_7c8;
  ulong local_7c0;
  long lStack_7b8;
  long *local_7b0;
  long local_7a8;
  long local_7a0;
  long lStack_798;
  ulong *local_790;
  long local_788;
  ulong local_780;
  long lStack_778;
  ulong *local_770;
  long local_768;
  ulong local_760;
  long lStack_758;
  ulong *local_750;
  long local_748;
  ulong local_740;
  long lStack_738;
  ulong *local_730;
  long local_728;
  ulong local_720;
  long lStack_718;
  long *local_710;
  long local_708;
  long local_700;
  long lStack_6f8;
  long *local_6f0;
  long local_6e8;
  long local_6e0;
  long lStack_6d8;
  ulong *local_6d0;
  long local_6c8;
  ulong local_6c0;
  long lStack_6b8;
  ulong *local_6b0;
  long local_6a8;
  ulong local_6a0;
  long lStack_698;
  ulong *local_690;
  long local_688;
  ulong local_680;
  long lStack_678;
  long *local_670;
  long local_668;
  long local_660;
  long lStack_658;
  ulong *local_650;
  long local_648;
  ulong local_640;
  long lStack_638;
  ulong *local_630;
  long local_628;
  ulong local_620;
  long lStack_618;
  long local_610;
  long *local_608;
  long local_600;
  long local_5f8;
  long lStack_5f0;
  long *local_5e8;
  long local_5e0;
  long local_5d8;
  long lStack_5d0;
  ulong *local_5c8;
  long local_5c0;
  ulong local_5b8;
  long lStack_5b0;
  ulong *local_5a8;
  long local_5a0;
  ulong local_598;
  long lStack_590;
  ulong *local_588;
  long local_580;
  ulong local_578;
  long lStack_570;
  char *local_568;
  uint local_560;
  char local_558 [16];
  ulong *local_548;
  long local_540;
  ulong local_538;
  long lStack_530;
  ulong *local_528;
  long local_520;
  ulong local_518;
  long lStack_510;
  ulong *local_508;
  long local_500;
  ulong local_4f8;
  long lStack_4f0;
  ulong *local_4e8;
  long local_4e0;
  ulong local_4d8;
  undefined8 uStack_4d0;
  undefined8 *local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 *local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  ulong *local_408;
  long local_400;
  ulong local_3f8;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  ulong *local_3e8;
  long local_3e0;
  ulong local_3d8;
  long lStack_3d0;
  ulong *local_3c8;
  long local_3c0;
  ulong local_3b8;
  long lStack_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  ulong *local_368;
  long local_360;
  ulong local_358 [2];
  ulong *local_348;
  long local_340;
  ulong local_338 [2];
  ulong *local_328;
  long local_320;
  ulong local_318 [2];
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  undefined8 *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  string local_268;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  long lStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158 [2];
  size_t local_148;
  uint local_13c;
  string *local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  cVar10 = '\x01';
  if (9 < depth) {
    sVar7 = depth;
    cVar12 = '\x04';
    do {
      cVar10 = cVar12;
      if (sVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0026c363;
      }
      if (sVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0026c363;
      }
      if (sVar7 < 10000) goto LAB_0026c363;
      bVar2 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar12 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_0026c363:
  local_568 = local_558;
  local_138 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_568,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_568,local_560,depth);
  pCVar13 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pCVar13,
             (pointer)((long)&(pCVar13->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_70,pCVar13,&local_50,depth,parallel);
  local_13c = (uint)parallel;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  cVar10 = (char)depth * '\x03' + '\x0f';
  local_608 = &local_5f8;
  std::__cxx11::string::_M_construct((ulong)&local_608,cVar10);
  local_148 = depth;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_608);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_7c0 = *puVar6;
    lStack_7b8 = plVar4[3];
    local_7d0 = &local_7c0;
  }
  else {
    local_7c0 = *puVar6;
    local_7d0 = (ulong *)*plVar4;
  }
  local_7c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_750 = &local_740;
  std::__cxx11::string::_M_construct((ulong)&local_750,cVar10);
  uVar16 = 0xf;
  if (local_7d0 != &local_7c0) {
    uVar16 = local_7c0;
  }
  if (uVar16 < (ulong)(local_748 + local_7c8)) {
    uVar16 = 0xf;
    if (local_750 != &local_740) {
      uVar16 = local_740;
    }
    if (uVar16 < (ulong)(local_748 + local_7c8)) goto LAB_0026c4fd;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_750,0,(char *)0x0,(ulong)local_7d0);
  }
  else {
LAB_0026c4fd:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d0,(ulong)local_750);
  }
  local_7b0 = &local_7a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_7a0 = *plVar4;
    lStack_798 = puVar5[3];
  }
  else {
    local_7a0 = *plVar4;
    local_7b0 = (long *)*puVar5;
  }
  local_7a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b0);
  local_6b0 = &local_6a0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_6a0 = *puVar6;
    lStack_698 = plVar4[3];
  }
  else {
    local_6a0 = *puVar6;
    local_6b0 = (ulong *)*plVar4;
  }
  local_6a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6b0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_710 = &local_700;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_700 = *plVar8;
    lStack_6f8 = plVar4[3];
  }
  else {
    local_700 = *plVar8;
    local_710 = (long *)*plVar4;
  }
  local_708 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_710);
  local_670 = &local_660;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_660 = *plVar8;
    lStack_658 = plVar4[3];
  }
  else {
    local_660 = *plVar8;
    local_670 = (long *)*plVar4;
  }
  local_668 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_670,(ulong)local_568);
  local_690 = &local_680;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_680 = *puVar6;
    lStack_678 = plVar4[3];
  }
  else {
    local_680 = *puVar6;
    local_690 = (ulong *)*plVar4;
  }
  local_688 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_690);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_800 = *puVar6;
    lStack_7f8 = plVar4[3];
    local_810 = &local_800;
  }
  else {
    local_800 = *puVar6;
    local_810 = (ulong *)*plVar4;
  }
  local_808 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_8b0 = &local_8a0;
  std::__cxx11::string::_M_construct((ulong)&local_8b0,cVar10);
  sVar7 = local_148;
  uVar16 = 0xf;
  if (local_810 != &local_800) {
    uVar16 = local_800;
  }
  if (uVar16 < (ulong)(local_8a8 + local_808)) {
    uVar16 = 0xf;
    if (local_8b0 != &local_8a0) {
      uVar16 = local_8a0;
    }
    if (uVar16 < (ulong)(local_8a8 + local_808)) goto LAB_0026c7df;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8b0,0,(char *)0x0,(ulong)local_810);
  }
  else {
LAB_0026c7df:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_810,(ulong)local_8b0);
  }
  local_730 = &local_720;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_720 = *puVar6;
    lStack_718 = puVar5[3];
  }
  else {
    local_720 = *puVar6;
    local_730 = (ulong *)*puVar5;
  }
  local_728 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_730);
  local_850 = &local_840;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_840 = *puVar6;
    lStack_838 = plVar4[3];
  }
  else {
    local_840 = *puVar6;
    local_850 = (ulong *)*plVar4;
  }
  local_848 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_850,(ulong)local_70._M_dataplus._M_p);
  local_830 = &local_820;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_820 = *puVar6;
    lStack_818 = plVar4[3];
  }
  else {
    local_820 = *puVar6;
    local_830 = (ulong *)*plVar4;
  }
  local_828 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_830);
  local_6f0 = &local_6e0;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_6e0 = *plVar8;
    lStack_6d8 = plVar4[3];
  }
  else {
    local_6e0 = *plVar8;
    local_6f0 = (long *)*plVar4;
  }
  local_6e8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_870 = &local_860;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_860 = *puVar6;
    lStack_858 = plVar4[3];
  }
  else {
    local_860 = *puVar6;
    local_870 = (ulong *)*plVar4;
  }
  local_868 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_870);
  local_910 = &local_900;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_900 = *plVar8;
    lStack_8f8 = plVar4[3];
  }
  else {
    local_900 = *plVar8;
    local_910 = (long *)*plVar4;
  }
  local_908 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_910,(ulong)(attr_name->_M_dataplus)._M_p);
  local_8d0 = &local_8c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_8c0 = *puVar6;
    lStack_8b8 = plVar4[3];
  }
  else {
    local_8c0 = *puVar6;
    local_8d0 = (ulong *)*plVar4;
  }
  local_8c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_8d0);
  local_990 = &local_980;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_980 = *puVar6;
    lStack_978 = plVar4[3];
  }
  else {
    local_980 = *puVar6;
    local_990 = (ulong *)*plVar4;
  }
  local_988 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_990,(ulong)(attr_name->_M_dataplus)._M_p);
  local_970 = &local_960;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_960 = *puVar6;
    lStack_958 = plVar4[3];
  }
  else {
    local_960 = *puVar6;
    local_970 = (ulong *)*plVar4;
  }
  local_968 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_970);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_940 = *puVar6;
    lStack_938 = plVar4[3];
    local_950 = &local_940;
  }
  else {
    local_940 = *puVar6;
    local_950 = (ulong *)*plVar4;
  }
  local_948 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_8f0 = &local_8e0;
  std::__cxx11::string::_M_construct((ulong)&local_8f0,cVar10);
  uVar16 = 0xf;
  if (local_950 != &local_940) {
    uVar16 = local_940;
  }
  if (uVar16 < (ulong)(local_8e8 + local_948)) {
    uVar16 = 0xf;
    if (local_8f0 != &local_8e0) {
      uVar16 = local_8e0;
    }
    if (uVar16 < (ulong)(local_8e8 + local_948)) goto LAB_0026cc3a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8f0,0,(char *)0x0,(ulong)local_950);
  }
  else {
LAB_0026cc3a:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_950,(ulong)local_8f0);
  }
  local_930 = &local_920;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_920 = *puVar6;
    lStack_918 = puVar5[3];
  }
  else {
    local_920 = *puVar6;
    local_930 = (ulong *)*puVar5;
  }
  local_928 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_930);
  local_9f0 = &local_9e0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_9e0 = *puVar6;
    lStack_9d8 = plVar4[3];
  }
  else {
    local_9e0 = *puVar6;
    local_9f0 = (ulong *)*plVar4;
  }
  local_9e8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_610 = sVar7 * 3 + 0x12;
  local_770 = &local_760;
  std::__cxx11::string::_M_construct((ulong)&local_770,(char)local_610);
  uVar16 = 0xf;
  if (local_9f0 != &local_9e0) {
    uVar16 = local_9e0;
  }
  if (uVar16 < (ulong)(local_768 + local_9e8)) {
    uVar16 = 0xf;
    if (local_770 != &local_760) {
      uVar16 = local_760;
    }
    if (uVar16 < (ulong)(local_768 + local_9e8)) goto LAB_0026cd92;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_770,0,(char *)0x0,(ulong)local_9f0);
  }
  else {
LAB_0026cd92:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9f0,(ulong)local_770);
  }
  local_890 = &local_880;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_880 = *plVar4;
    lStack_878 = puVar5[3];
  }
  else {
    local_880 = *plVar4;
    local_890 = (long *)*puVar5;
  }
  local_888 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_890);
  local_9d0 = &local_9c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_9c0 = *puVar6;
    lStack_9b8 = plVar4[3];
  }
  else {
    local_9c0 = *puVar6;
    local_9d0 = (ulong *)*plVar4;
  }
  local_9c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_7f0 = &local_7e0;
  std::__cxx11::string::_M_construct((ulong)&local_7f0,(char)local_610);
  uVar16 = 0xf;
  if (local_9d0 != &local_9c0) {
    uVar16 = local_9c0;
  }
  if (uVar16 < (ulong)(local_7e8 + local_9c8)) {
    uVar16 = 0xf;
    if (local_7f0 != &local_7e0) {
      uVar16 = local_7e0;
    }
    if (uVar16 < (ulong)(local_7e8 + local_9c8)) goto LAB_0026ced7;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7f0,0,(char *)0x0,(ulong)local_9d0);
  }
  else {
LAB_0026ced7:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9d0,(ulong)local_7f0);
  }
  local_9b0 = &local_9a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_9a0 = *plVar4;
    lStack_998 = puVar5[3];
  }
  else {
    local_9a0 = *plVar4;
    local_9b0 = (long *)*puVar5;
  }
  local_9a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_9b0);
  local_6d0 = &local_6c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_6c0 = *puVar6;
    lStack_6b8 = plVar4[3];
  }
  else {
    local_6c0 = *puVar6;
    local_6d0 = (ulong *)*plVar4;
  }
  local_6c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_790 = &local_780;
  std::__cxx11::string::_M_construct((ulong)&local_790,cVar10);
  uVar16 = 0xf;
  if (local_6d0 != &local_6c0) {
    uVar16 = local_6c0;
  }
  if (uVar16 < (ulong)(local_788 + local_6c8)) {
    uVar16 = 0xf;
    if (local_790 != &local_780) {
      uVar16 = local_780;
    }
    if (uVar16 < (ulong)(local_788 + local_6c8)) goto LAB_0026d020;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_790,0,(char *)0x0,(ulong)local_6d0);
  }
  else {
LAB_0026d020:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d0,(ulong)local_790);
  }
  local_5e8 = &local_5d8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_5d8 = *plVar4;
    lStack_5d0 = puVar5[3];
  }
  else {
    local_5d8 = *plVar4;
    local_5e8 = (long *)*puVar5;
  }
  local_5e0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5e8);
  local_130 = &local_120;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar4[3];
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8);
  }
  if (local_790 != &local_780) {
    operator_delete(local_790);
  }
  if (local_6d0 != &local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0);
  }
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890);
  }
  if (local_770 != &local_760) {
    operator_delete(local_770);
  }
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830);
  }
  if (local_850 != &local_840) {
    operator_delete(local_850);
  }
  if (local_730 != &local_720) {
    operator_delete(local_730);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810);
  }
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670);
  }
  if (local_710 != &local_700) {
    operator_delete(local_710);
  }
  if (local_6b0 != &local_6a0) {
    operator_delete(local_6b0);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608);
  }
  local_2e8 = &local_2d8;
  std::__cxx11::string::_M_construct((ulong)&local_2e8,cVar10);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_548 = &local_538;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_538 = *puVar6;
    lStack_530 = plVar4[3];
  }
  else {
    local_538 = *puVar6;
    local_548 = (ulong *)*plVar4;
  }
  local_540 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_3e8 = &local_3d8;
  std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar10);
  uVar16 = 0xf;
  if (local_548 != &local_538) {
    uVar16 = local_538;
  }
  if (uVar16 < (ulong)(local_3e0 + local_540)) {
    uVar16 = 0xf;
    if (local_3e8 != &local_3d8) {
      uVar16 = local_3d8;
    }
    if (uVar16 < (ulong)(local_3e0 + local_540)) goto LAB_0026d4fa;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,(ulong)local_548);
  }
  else {
LAB_0026d4fa:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_548,(ulong)local_3e8);
  }
  local_4c8 = &local_4b8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_4b8 = *puVar1;
    uStack_4b0 = puVar5[3];
  }
  else {
    local_4b8 = *puVar1;
    local_4c8 = (undefined8 *)*puVar5;
  }
  local_4c0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  local_2c8 = &local_2b8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_2b8 = *puVar6;
    lStack_2b0 = plVar4[3];
  }
  else {
    local_2b8 = *puVar6;
    local_2c8 = (ulong *)*plVar4;
  }
  local_2c0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar10);
  uVar16 = 0xf;
  if (local_2c8 != &local_2b8) {
    uVar16 = local_2b8;
  }
  if (uVar16 < (ulong)(local_1a0 + local_2c0)) {
    uVar16 = 0xf;
    if (local_1a8 != &local_198) {
      uVar16 = local_198;
    }
    if (uVar16 < (ulong)(local_1a0 + local_2c0)) goto LAB_0026d655;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_2c8);
  }
  else {
LAB_0026d655:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_1a8);
  }
  local_188 = &local_178;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_178 = *plVar4;
    lStack_170 = puVar5[3];
  }
  else {
    local_178 = *plVar4;
    local_188 = (long *)*puVar5;
  }
  local_180 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_2a8 = &local_298;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_298 = *puVar6;
    lStack_290 = plVar4[3];
  }
  else {
    local_298 = *puVar6;
    local_2a8 = (ulong *)*plVar4;
  }
  local_2a0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2a8,(ulong)local_70._M_dataplus._M_p);
  local_3a8 = &local_398;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_398 = *plVar8;
    lStack_390 = plVar4[3];
  }
  else {
    local_398 = *plVar8;
    local_3a8 = (long *)*plVar4;
  }
  local_3a0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_528 = &local_518;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_518 = *puVar6;
    lStack_510 = plVar4[3];
  }
  else {
    local_518 = *puVar6;
    local_528 = (ulong *)*plVar4;
  }
  local_520 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar10);
  uVar16 = 0xf;
  if (local_528 != &local_518) {
    uVar16 = local_518;
  }
  if (uVar16 < (ulong)(local_1c0 + local_520)) {
    uVar16 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar16 = local_1b8;
    }
    if (uVar16 < (ulong)(local_1c0 + local_520)) goto LAB_0026d87b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_528);
  }
  else {
LAB_0026d87b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_1c8);
  }
  local_4a8 = &local_498;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_498 = *puVar1;
    uStack_490 = puVar5[3];
  }
  else {
    local_498 = *puVar1;
    local_4a8 = (undefined8 *)*puVar5;
  }
  local_4a0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  local_508 = &local_4f8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_4f8 = *puVar6;
    lStack_4f0 = plVar4[3];
  }
  else {
    local_4f8 = *puVar6;
    local_508 = (ulong *)*plVar4;
  }
  local_500 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_4e8 = &local_4d8;
  std::__cxx11::string::_M_construct((ulong)&local_4e8,cVar10);
  uVar16 = 0xf;
  if (local_508 != &local_4f8) {
    uVar16 = local_4f8;
  }
  if (uVar16 < (ulong)(local_4e0 + local_500)) {
    uVar16 = 0xf;
    if (local_4e8 != &local_4d8) {
      uVar16 = local_4d8;
    }
    if (uVar16 < (ulong)(local_4e0 + local_500)) goto LAB_0026d9d6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4e8,0,(char *)0x0,(ulong)local_508);
  }
  else {
LAB_0026d9d6:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_508,(ulong)local_4e8);
  }
  local_488 = &local_478;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_478 = *puVar1;
    uStack_470 = puVar5[3];
  }
  else {
    local_478 = *puVar1;
    local_488 = (undefined8 *)*puVar5;
  }
  local_480 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_488);
  local_288 = &local_278;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_278 = *puVar6;
    lStack_270 = plVar4[3];
  }
  else {
    local_278 = *puVar6;
    local_288 = (ulong *)*plVar4;
  }
  local_280 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_408 = &local_3f8;
  std::__cxx11::string::_M_construct((ulong)&local_408,cVar10);
  uVar16 = 0xf;
  if (local_288 != &local_278) {
    uVar16 = local_278;
  }
  if (uVar16 < (ulong)(local_400 + local_280)) {
    uVar16 = 0xf;
    if (local_408 != &local_3f8) {
      uVar16 = local_3f8;
    }
    if (uVar16 < (ulong)(local_400 + local_280)) goto LAB_0026db31;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_408,0,(char *)0x0,(ulong)local_288);
  }
  else {
LAB_0026db31:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_408);
  }
  local_5c8 = &local_5b8;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_5b8 = *puVar6;
    lStack_5b0 = puVar5[3];
  }
  else {
    local_5b8 = *puVar6;
    local_5c8 = (ulong *)*puVar5;
  }
  local_5c0 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5c8);
  local_650 = &local_640;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_640 = *puVar6;
    lStack_638 = plVar4[3];
  }
  else {
    local_640 = *puVar6;
    local_650 = (ulong *)*plVar4;
  }
  local_648 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)local_610);
  uVar16 = 0xf;
  if (local_650 != &local_640) {
    uVar16 = local_640;
  }
  if (uVar16 < (ulong)(local_1e0 + local_648)) {
    uVar16 = 0xf;
    if (local_1e8 != &local_1d8) {
      uVar16 = local_1d8;
    }
    if (uVar16 < (ulong)(local_1e0 + local_648)) goto LAB_0026dc91;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_650);
  }
  else {
LAB_0026dc91:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_650,(ulong)local_1e8);
  }
  local_5a8 = &local_598;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_598 = *puVar6;
    lStack_590 = puVar5[3];
  }
  else {
    local_598 = *puVar6;
    local_5a8 = (ulong *)*puVar5;
  }
  local_5a0 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_630 = &local_620;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_620 = *puVar6;
    lStack_618 = plVar4[3];
  }
  else {
    local_620 = *puVar6;
    local_630 = (ulong *)*plVar4;
  }
  local_628 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct((ulong)&local_208,(char)local_610);
  uVar16 = 0xf;
  if (local_630 != &local_620) {
    uVar16 = local_620;
  }
  if (uVar16 < (ulong)(local_200 + local_628)) {
    uVar16 = 0xf;
    if (local_208 != &local_1f8) {
      uVar16 = local_1f8;
    }
    if (uVar16 < (ulong)(local_200 + local_628)) goto LAB_0026ddf1;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_630);
  }
  else {
LAB_0026ddf1:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_630,(ulong)local_208);
  }
  local_588 = &local_578;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_578 = *puVar6;
    lStack_570 = puVar5[3];
  }
  else {
    local_578 = *puVar6;
    local_588 = (ulong *)*puVar5;
  }
  local_580 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_588);
  local_3c8 = &local_3b8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_3b8 = *puVar6;
    lStack_3b0 = plVar4[3];
  }
  else {
    local_3b8 = *puVar6;
    local_3c8 = (ulong *)*plVar4;
  }
  local_3c0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_3c8,(ulong)(attr_name->_M_dataplus)._M_p);
  local_468 = &local_458;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_458 = *plVar8;
    lStack_450 = plVar4[3];
  }
  else {
    local_458 = *plVar8;
    local_468 = (long *)*plVar4;
  }
  local_460 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_468);
  local_448 = &local_438;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_438 = *plVar8;
    lStack_430 = plVar4[3];
  }
  else {
    local_438 = *plVar8;
    local_448 = (long *)*plVar4;
  }
  local_440 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_448,(ulong)(rel_name->_M_dataplus)._M_p);
  local_428 = &local_418;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_418 = *plVar8;
    lStack_410 = plVar4[3];
  }
  else {
    local_418 = *plVar8;
    local_428 = (long *)*plVar4;
  }
  local_420 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_428);
  local_790 = &local_780;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_780 = *puVar6;
    lStack_778 = plVar4[3];
  }
  else {
    local_780 = *puVar6;
    local_790 = (ulong *)*plVar4;
  }
  local_788 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_790,(ulong)(attr_name->_M_dataplus)._M_p);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_7e0 = *puVar6;
    lStack_7d8 = plVar4[3];
    local_7f0 = &local_7e0;
  }
  else {
    local_7e0 = *puVar6;
    local_7f0 = (ulong *)*plVar4;
  }
  local_7e8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7f0);
  local_770 = &local_760;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_760 = *puVar6;
    lStack_758 = plVar4[3];
  }
  else {
    local_760 = *puVar6;
    local_770 = (ulong *)*plVar4;
  }
  local_768 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar12 = (char)(sVar7 * 3);
  cVar11 = cVar12 + '\x15';
  local_228 = &local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,cVar11);
  uVar16 = 0xf;
  if (local_770 != &local_760) {
    uVar16 = local_760;
  }
  if (uVar16 < (ulong)(local_220 + local_768)) {
    uVar16 = 0xf;
    if (local_228 != &local_218) {
      uVar16 = local_218;
    }
    if (uVar16 < (ulong)(local_220 + local_768)) goto LAB_0026e19b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_770);
  }
  else {
LAB_0026e19b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_770,(ulong)local_228);
  }
  local_8f0 = &local_8e0;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_8e0 = *puVar6;
    lStack_8d8 = puVar5[3];
  }
  else {
    local_8e0 = *puVar6;
    local_8f0 = (ulong *)*puVar5;
  }
  local_8e8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_8f0);
  local_8b0 = &local_8a0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_8a0 = *puVar6;
    lStack_898 = plVar4[3];
  }
  else {
    local_8a0 = *puVar6;
    local_8b0 = (ulong *)*plVar4;
  }
  local_8a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_248 = &local_238;
  std::__cxx11::string::_M_construct((ulong)&local_248,(char)local_610);
  uVar16 = 0xf;
  if (local_8b0 != &local_8a0) {
    uVar16 = local_8a0;
  }
  if (uVar16 < (ulong)(local_240 + local_8a8)) {
    uVar16 = 0xf;
    if (local_248 != &local_238) {
      uVar16 = local_238;
    }
    if (uVar16 < (ulong)(local_240 + local_8a8)) goto LAB_0026e303;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_8b0);
  }
  else {
LAB_0026e303:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b0,(ulong)local_248);
  }
  local_750 = &local_740;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_740 = *puVar6;
    lStack_738 = puVar5[3];
  }
  else {
    local_740 = *puVar6;
    local_750 = (ulong *)*puVar5;
  }
  local_748 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_750);
  local_608 = &local_5f8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_5f8 = *plVar8;
    lStack_5f0 = plVar4[3];
  }
  else {
    local_5f8 = *plVar8;
    local_608 = (long *)*plVar4;
  }
  local_600 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_608,(ulong)(attr_name->_M_dataplus)._M_p);
  local_7d0 = &local_7c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_7c0 = *puVar6;
    lStack_7b8 = plVar4[3];
  }
  else {
    local_7c0 = *puVar6;
    local_7d0 = (ulong *)*plVar4;
  }
  local_7c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_7d0);
  local_7b0 = &local_7a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_7a0 = *plVar4;
    lStack_798 = puVar5[3];
  }
  else {
    local_7a0 = *plVar4;
    local_7b0 = (long *)*puVar5;
  }
  local_7a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_7b0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_6b0 = &local_6a0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_6a0 = *puVar6;
    lStack_698 = plVar4[3];
  }
  else {
    local_6a0 = *puVar6;
    local_6b0 = (ulong *)*plVar4;
  }
  local_6a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_6b0);
  local_710 = &local_700;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_700 = *plVar4;
    lStack_6f8 = puVar5[3];
  }
  else {
    local_700 = *plVar4;
    local_710 = (long *)*puVar5;
  }
  local_708 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_710,(ulong)(attr_name->_M_dataplus)._M_p);
  local_670 = &local_660;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_660 = *plVar8;
    lStack_658 = plVar4[3];
  }
  else {
    local_660 = *plVar8;
    local_670 = (long *)*plVar4;
  }
  local_668 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_670);
  local_690 = &local_680;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_680 = *puVar6;
    lStack_678 = plVar4[3];
  }
  else {
    local_680 = *puVar6;
    local_690 = (ulong *)*plVar4;
  }
  local_688 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,cVar11);
  uVar16 = 0xf;
  if (local_690 != &local_680) {
    uVar16 = local_680;
  }
  if (uVar16 < (ulong)(local_160 + local_688)) {
    uVar16 = 0xf;
    if (local_168 != local_158) {
      uVar16 = local_158[0];
    }
    if (uVar16 < (ulong)(local_160 + local_688)) goto LAB_0026e6c4;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_690);
  }
  else {
LAB_0026e6c4:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_690,(ulong)local_168);
  }
  local_810 = &local_800;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_800 = *puVar6;
    lStack_7f8 = puVar5[3];
  }
  else {
    local_800 = *puVar6;
    local_810 = (ulong *)*puVar5;
  }
  local_808 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_810);
  local_730 = &local_720;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_720 = *puVar6;
    lStack_718 = plVar4[3];
  }
  else {
    local_720 = *puVar6;
    local_730 = (ulong *)*plVar4;
  }
  local_728 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_268,(char)local_610);
  uVar16 = 0xf;
  if (local_730 != &local_720) {
    uVar16 = local_720;
  }
  if (uVar16 < local_268._M_string_length + local_728) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      uVar15 = local_268.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_268._M_string_length + local_728) goto LAB_0026e82c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_730);
  }
  else {
LAB_0026e82c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_730,(ulong)local_268._M_dataplus._M_p);
  }
  local_850 = &local_840;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_840 = *puVar6;
    lStack_838 = puVar5[3];
  }
  else {
    local_840 = *puVar6;
    local_850 = (ulong *)*puVar5;
  }
  local_848 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_850);
  local_830 = &local_820;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_820 = *puVar6;
    lStack_818 = plVar4[3];
  }
  else {
    local_820 = *puVar6;
    local_830 = (ulong *)*plVar4;
  }
  local_828 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct((ulong)&local_308,cVar11);
  uVar16 = 0xf;
  if (local_830 != &local_820) {
    uVar16 = local_820;
  }
  if (uVar16 < (ulong)(local_300 + local_828)) {
    uVar16 = 0xf;
    if (local_308 != local_2f8) {
      uVar16 = local_2f8[0];
    }
    if (uVar16 < (ulong)(local_300 + local_828)) goto LAB_0026e98f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_830);
  }
  else {
LAB_0026e98f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_830,(ulong)local_308);
  }
  local_6f0 = &local_6e0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_6e0 = *plVar4;
    lStack_6d8 = puVar5[3];
  }
  else {
    local_6e0 = *plVar4;
    local_6f0 = (long *)*puVar5;
  }
  local_6e8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6f0);
  local_870 = &local_860;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_860 = *puVar6;
    lStack_858 = plVar4[3];
  }
  else {
    local_860 = *puVar6;
    local_870 = (ulong *)*plVar4;
  }
  local_868 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_328 = local_318;
  std::__cxx11::string::_M_construct((ulong)&local_328,(char)local_610);
  uVar16 = 0xf;
  if (local_870 != &local_860) {
    uVar16 = local_860;
  }
  if (uVar16 < (ulong)(local_320 + local_868)) {
    uVar16 = 0xf;
    if (local_328 != local_318) {
      uVar16 = local_318[0];
    }
    if (uVar16 < (ulong)(local_320 + local_868)) goto LAB_0026eaf7;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)local_870);
  }
  else {
LAB_0026eaf7:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_870,(ulong)local_328);
  }
  local_910 = &local_900;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_900 = *plVar4;
    lStack_8f8 = puVar5[3];
  }
  else {
    local_900 = *plVar4;
    local_910 = (long *)*puVar5;
  }
  local_908 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_910);
  local_8d0 = &local_8c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_8c0 = *puVar6;
    lStack_8b8 = plVar4[3];
  }
  else {
    local_8c0 = *puVar6;
    local_8d0 = (ulong *)*plVar4;
  }
  local_8c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_348 = local_338;
  std::__cxx11::string::_M_construct((ulong)&local_348,cVar11);
  uVar16 = 0xf;
  if (local_8d0 != &local_8c0) {
    uVar16 = local_8c0;
  }
  if (uVar16 < (ulong)(local_340 + local_8c8)) {
    uVar16 = 0xf;
    if (local_348 != local_338) {
      uVar16 = local_338[0];
    }
    if (uVar16 < (ulong)(local_340 + local_8c8)) goto LAB_0026ec62;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_8d0);
  }
  else {
LAB_0026ec62:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8d0,(ulong)local_348);
  }
  local_990 = &local_980;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_980 = *puVar6;
    lStack_978 = puVar5[3];
  }
  else {
    local_980 = *puVar6;
    local_990 = (ulong *)*puVar5;
  }
  local_988 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_990);
  local_970 = &local_960;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_960 = *puVar6;
    lStack_958 = plVar4[3];
  }
  else {
    local_960 = *puVar6;
    local_970 = (ulong *)*plVar4;
  }
  local_968 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_368 = local_358;
  std::__cxx11::string::_M_construct((ulong)&local_368,cVar10);
  uVar16 = 0xf;
  if (local_970 != &local_960) {
    uVar16 = local_960;
  }
  if (uVar16 < (ulong)(local_360 + local_968)) {
    uVar16 = 0xf;
    if (local_368 != local_358) {
      uVar16 = local_358[0];
    }
    if (uVar16 < (ulong)(local_360 + local_968)) goto LAB_0026edb3;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_970);
  }
  else {
LAB_0026edb3:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_970,(ulong)local_368);
  }
  local_950 = &local_940;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_940 = *puVar6;
    lStack_938 = puVar5[3];
  }
  else {
    local_940 = *puVar6;
    local_950 = (ulong *)*puVar5;
  }
  local_948 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_950);
  local_930 = &local_920;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_920 = *puVar6;
    lStack_918 = plVar4[3];
  }
  else {
    local_920 = *puVar6;
    local_930 = (ulong *)*plVar4;
  }
  local_928 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_388 = local_378;
  std::__cxx11::string::_M_construct((ulong)&local_388,cVar10);
  uVar16 = 0xf;
  if (local_930 != &local_920) {
    uVar16 = local_920;
  }
  if (uVar16 < (ulong)(local_380 + local_928)) {
    uVar16 = 0xf;
    if (local_388 != local_378) {
      uVar16 = local_378[0];
    }
    if (uVar16 < (ulong)(local_380 + local_928)) goto LAB_0026ef16;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_930);
  }
  else {
LAB_0026ef16:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_930,(ulong)local_388);
  }
  local_9f0 = &local_9e0;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_9e0 = *puVar6;
    lStack_9d8 = puVar5[3];
  }
  else {
    local_9e0 = *puVar6;
    local_9f0 = (ulong *)*puVar5;
  }
  local_9e8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_9f0);
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_880 = *plVar4;
    lStack_878 = puVar5[3];
    local_890 = &local_880;
  }
  else {
    local_880 = *plVar4;
    local_890 = (long *)*puVar5;
  }
  local_888 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_890,(ulong)(rel_name->_M_dataplus)._M_p);
  local_9d0 = &local_9c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_9c0 = *puVar6;
    lStack_9b8 = plVar4[3];
  }
  else {
    local_9c0 = *puVar6;
    local_9d0 = (ulong *)*plVar4;
  }
  local_9c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_9d0);
  local_9b0 = &local_9a0;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_9a0 = *plVar8;
    lStack_998 = plVar4[3];
  }
  else {
    local_9a0 = *plVar8;
    local_9b0 = (long *)*plVar4;
  }
  local_9a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_9b0,(ulong)local_568);
  local_6d0 = &local_6c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_6c0 = *puVar6;
    lStack_6b8 = plVar4[3];
  }
  else {
    local_6c0 = *puVar6;
    local_6d0 = (ulong *)*plVar4;
  }
  local_6c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6d0);
  local_5e8 = &local_5d8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_5d8 = *plVar8;
    lStack_5d0 = plVar4[3];
  }
  else {
    local_5d8 = *plVar8;
    local_5e8 = (long *)*plVar4;
  }
  local_5e0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_5e8);
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8);
  }
  if (local_6d0 != &local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0);
  }
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890);
  }
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830);
  }
  if (local_850 != &local_840) {
    operator_delete(local_850);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_730 != &local_720) {
    operator_delete(local_730);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670);
  }
  if (local_710 != &local_700) {
    operator_delete(local_710);
  }
  if (local_6b0 != &local_6a0) {
    operator_delete(local_6b0);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_770 != &local_760) {
    operator_delete(local_770);
  }
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_790 != &local_780) {
    operator_delete(local_790);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_630 != &local_620) {
    operator_delete(local_630);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_650 != &local_640) {
    operator_delete(local_650);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488);
  }
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  local_5e8 = &local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"");
  cVar12 = cVar12 + '\f';
  if (firstFactor) {
    local_870 = &local_860;
    std::__cxx11::string::_M_construct((ulong)&local_870,cVar12);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_870);
    local_910 = &local_900;
    plVar8 = plVar4 + 2;
    if ((long *)*plVar4 == plVar8) {
      local_900 = *plVar8;
      lStack_8f8 = plVar4[3];
    }
    else {
      local_900 = *plVar8;
      local_910 = (long *)*plVar4;
    }
    local_908 = plVar4[1];
    *plVar4 = (long)plVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_910,(ulong)(attr_name->_M_dataplus)._M_p);
    local_8d0 = &local_8c0;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_8c0 = *puVar6;
      lStack_8b8 = plVar4[3];
    }
    else {
      local_8c0 = *puVar6;
      local_8d0 = (ulong *)*plVar4;
    }
    local_8c8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_8d0);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_980 = *puVar6;
      lStack_978 = plVar4[3];
      local_990 = &local_980;
    }
    else {
      local_980 = *puVar6;
      local_990 = (ulong *)*plVar4;
    }
    local_988 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_990,(ulong)(rel_name->_M_dataplus)._M_p)
    ;
    local_970 = &local_960;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_960 = *puVar6;
      lStack_958 = puVar5[3];
    }
    else {
      local_960 = *puVar6;
      local_970 = (ulong *)*puVar5;
    }
    local_968 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_970);
    local_950 = &local_940;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_940 = *puVar6;
      lStack_938 = plVar4[3];
    }
    else {
      local_940 = *puVar6;
      local_950 = (ulong *)*plVar4;
    }
    local_948 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_950,(ulong)(rel_name->_M_dataplus)._M_p);
    local_930 = &local_920;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_920 = *puVar6;
      lStack_918 = plVar4[3];
    }
    else {
      local_920 = *puVar6;
      local_930 = (ulong *)*plVar4;
    }
    local_928 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_930);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_9e0 = *puVar6;
      lStack_9d8 = plVar4[3];
      local_9f0 = &local_9e0;
    }
    else {
      local_9e0 = *puVar6;
      local_9f0 = (ulong *)*plVar4;
    }
    local_9e8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9f0,(ulong)local_568);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_880 = *plVar4;
      lStack_878 = puVar5[3];
      local_890 = &local_880;
    }
    else {
      local_880 = *plVar4;
      local_890 = (long *)*puVar5;
    }
    local_888 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_890);
    local_9d0 = &local_9c0;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_9c0 = *puVar6;
      lStack_9b8 = plVar4[3];
    }
    else {
      local_9c0 = *puVar6;
      local_9d0 = (ulong *)*plVar4;
    }
    local_9c8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_9d0,(ulong)(attr_name->_M_dataplus)._M_p);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_9a0 = *plVar4;
      lStack_998 = puVar5[3];
      local_9b0 = &local_9a0;
    }
    else {
      local_9a0 = *plVar4;
      local_9b0 = (long *)*puVar5;
    }
    local_9a8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_9b0);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_6c0 = *puVar6;
      lStack_6b8 = plVar4[3];
      local_6d0 = &local_6c0;
    }
    else {
      local_6c0 = *puVar6;
      local_6d0 = (ulong *)*plVar4;
    }
    local_6c8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_5e8,(string *)&local_6d0);
    if (local_6d0 != &local_6c0) {
      operator_delete(local_6d0);
    }
    if (local_9b0 != &local_9a0) {
      operator_delete(local_9b0);
    }
    if (local_9d0 != &local_9c0) {
      operator_delete(local_9d0);
    }
    if (local_890 != &local_880) {
      operator_delete(local_890);
    }
    sVar7 = local_148;
    if (local_9f0 != &local_9e0) {
      operator_delete(local_9f0);
    }
    if (local_930 != &local_920) {
      operator_delete(local_930);
    }
    if (local_950 != &local_940) {
      operator_delete(local_950);
    }
    if (local_970 != &local_960) {
      operator_delete(local_970);
    }
    if (local_990 != &local_980) {
      operator_delete(local_990);
    }
    if (local_8d0 != &local_8c0) {
      operator_delete(local_8d0);
    }
    if (local_910 != &local_900) {
      operator_delete(local_910);
    }
    puVar6 = &local_860;
    puVar14 = local_870;
  }
  else {
    local_3c8 = &local_3b8;
    std::__cxx11::string::_M_construct((ulong)&local_3c8,cVar12);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c8);
    local_468 = &local_458;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_458 = *plVar4;
      lStack_450 = puVar5[3];
    }
    else {
      local_458 = *plVar4;
      local_468 = (long *)*puVar5;
    }
    local_460 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_468,(ulong)(attr_name->_M_dataplus)._M_p);
    local_448 = &local_438;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_438 = *plVar4;
      lStack_430 = puVar5[3];
    }
    else {
      local_438 = *plVar4;
      local_448 = (long *)*puVar5;
    }
    local_440 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
    local_428 = &local_418;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_418 = *plVar4;
      lStack_410 = puVar5[3];
    }
    else {
      local_418 = *plVar4;
      local_428 = (long *)*puVar5;
    }
    local_420 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_428,(ulong)(rel_name->_M_dataplus)._M_p)
    ;
    local_790 = &local_780;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_780 = *puVar6;
      lStack_778 = puVar5[3];
    }
    else {
      local_780 = *puVar6;
      local_790 = (ulong *)*puVar5;
    }
    local_788 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_790);
    local_7f0 = &local_7e0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_7e0 = *puVar6;
      lStack_7d8 = puVar5[3];
    }
    else {
      local_7e0 = *puVar6;
      local_7f0 = (ulong *)*puVar5;
    }
    local_7e8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)(rel_name->_M_dataplus)._M_p)
    ;
    local_770 = &local_760;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_760 = *puVar6;
      lStack_758 = puVar5[3];
    }
    else {
      local_760 = *puVar6;
      local_770 = (ulong *)*puVar5;
    }
    local_768 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_770);
    local_8f0 = &local_8e0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_8e0 = *puVar6;
      lStack_8d8 = puVar5[3];
    }
    else {
      local_8e0 = *puVar6;
      local_8f0 = (ulong *)*puVar5;
    }
    local_8e8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8f0,(ulong)local_568);
    local_8b0 = &local_8a0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_8a0 = *puVar6;
      lStack_898 = puVar5[3];
    }
    else {
      local_8a0 = *puVar6;
      local_8b0 = (ulong *)*puVar5;
    }
    local_8a8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_8b0);
    local_750 = &local_740;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_740 = *puVar6;
      lStack_738 = puVar5[3];
    }
    else {
      local_740 = *puVar6;
      local_750 = (ulong *)*puVar5;
    }
    local_748 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_750,(ulong)(attr_name->_M_dataplus)._M_p);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_5f8 = *plVar4;
      lStack_5f0 = puVar5[3];
      local_608 = &local_5f8;
    }
    else {
      local_5f8 = *plVar4;
      local_608 = (long *)*puVar5;
    }
    local_600 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_608);
    local_7d0 = &local_7c0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_7c0 = *puVar6;
      lStack_7b8 = puVar5[3];
    }
    else {
      local_7c0 = *puVar6;
      local_7d0 = (ulong *)*puVar5;
    }
    local_7c8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_588 = &local_578;
    std::__cxx11::string::_M_construct((ulong)&local_588,cVar12);
    uVar16 = 0xf;
    if (local_7d0 != &local_7c0) {
      uVar16 = local_7c0;
    }
    if (uVar16 < (ulong)(local_580 + local_7c8)) {
      uVar16 = 0xf;
      if (local_588 != &local_578) {
        uVar16 = local_578;
      }
      if (uVar16 < (ulong)(local_580 + local_7c8)) goto LAB_002702d7;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,(ulong)local_7d0);
    }
    else {
LAB_002702d7:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d0,(ulong)local_588);
    }
    local_7b0 = &local_7a0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_7a0 = *plVar4;
      lStack_798 = puVar5[3];
    }
    else {
      local_7a0 = *plVar4;
      local_7b0 = (long *)*puVar5;
    }
    local_7a8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_7b0);
    local_6b0 = &local_6a0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_6a0 = *puVar6;
      lStack_698 = puVar5[3];
    }
    else {
      local_6a0 = *puVar6;
      local_6b0 = (ulong *)*puVar5;
    }
    local_6a8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_630 = &local_620;
    std::__cxx11::string::_M_construct((ulong)&local_630,cVar10);
    uVar16 = 0xf;
    if (local_6b0 != &local_6a0) {
      uVar16 = local_6a0;
    }
    if (uVar16 < (ulong)(local_628 + local_6a8)) {
      uVar16 = 0xf;
      if (local_630 != &local_620) {
        uVar16 = local_620;
      }
      if (uVar16 < (ulong)(local_628 + local_6a8)) goto LAB_00270439;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_630,0,(char *)0x0,(ulong)local_6b0);
    }
    else {
LAB_00270439:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6b0,(ulong)local_630);
    }
    local_710 = &local_700;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_700 = *plVar4;
      lStack_6f8 = puVar5[3];
    }
    else {
      local_700 = *plVar4;
      local_710 = (long *)*puVar5;
    }
    local_708 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_710);
    local_670 = &local_660;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_660 = *plVar4;
      lStack_658 = puVar5[3];
    }
    else {
      local_660 = *plVar4;
      local_670 = (long *)*puVar5;
    }
    local_668 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_670,(ulong)(attr_name->_M_dataplus)._M_p);
    local_690 = &local_680;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_680 = *puVar6;
      lStack_678 = puVar5[3];
    }
    else {
      local_680 = *puVar6;
      local_690 = (ulong *)*puVar5;
    }
    local_688 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_690);
    local_810 = &local_800;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_800 = *puVar6;
      lStack_7f8 = puVar5[3];
    }
    else {
      local_800 = *puVar6;
      local_810 = (ulong *)*puVar5;
    }
    local_808 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_810,(ulong)(rel_name->_M_dataplus)._M_p)
    ;
    local_730 = &local_720;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_720 = *puVar6;
      lStack_718 = puVar5[3];
    }
    else {
      local_720 = *puVar6;
      local_730 = (ulong *)*puVar5;
    }
    local_728 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_730);
    local_850 = &local_840;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_840 = *puVar6;
      lStack_838 = puVar5[3];
    }
    else {
      local_840 = *puVar6;
      local_850 = (ulong *)*puVar5;
    }
    local_848 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_850,(ulong)(rel_name->_M_dataplus)._M_p)
    ;
    local_830 = &local_820;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_820 = *puVar6;
      lStack_818 = puVar5[3];
    }
    else {
      local_820 = *puVar6;
      local_830 = (ulong *)*puVar5;
    }
    local_828 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_830);
    local_6f0 = &local_6e0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_6e0 = *plVar4;
      lStack_6d8 = puVar5[3];
    }
    else {
      local_6e0 = *plVar4;
      local_6f0 = (long *)*puVar5;
    }
    local_6e8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6f0,(ulong)local_568);
    local_870 = &local_860;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_860 = *puVar6;
      lStack_858 = puVar5[3];
    }
    else {
      local_860 = *puVar6;
      local_870 = (ulong *)*puVar5;
    }
    local_868 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_870);
    local_910 = &local_900;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_900 = *plVar4;
      lStack_8f8 = puVar5[3];
    }
    else {
      local_900 = *plVar4;
      local_910 = (long *)*puVar5;
    }
    local_908 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_910,(ulong)(attr_name->_M_dataplus)._M_p);
    local_8d0 = &local_8c0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_8c0 = *puVar6;
      lStack_8b8 = puVar5[3];
    }
    else {
      local_8c0 = *puVar6;
      local_8d0 = (ulong *)*puVar5;
    }
    local_8c8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_8d0);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_980 = *puVar6;
      lStack_978 = puVar5[3];
      local_990 = &local_980;
    }
    else {
      local_980 = *puVar6;
      local_990 = (ulong *)*puVar5;
    }
    local_988 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_5a8 = &local_598;
    std::__cxx11::string::_M_construct((ulong)&local_5a8,cVar10);
    uVar16 = 0xf;
    if (local_990 != &local_980) {
      uVar16 = local_980;
    }
    if (uVar16 < (ulong)(local_5a0 + local_988)) {
      uVar16 = 0xf;
      if (local_5a8 != &local_598) {
        uVar16 = local_598;
      }
      if (uVar16 < (ulong)(local_5a0 + local_988)) goto LAB_00270976;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_5a8,0,(char *)0x0,(ulong)local_990);
    }
    else {
LAB_00270976:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_990,(ulong)local_5a8);
    }
    local_970 = &local_960;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_960 = *puVar6;
      lStack_958 = puVar5[3];
    }
    else {
      local_960 = *puVar6;
      local_970 = (ulong *)*puVar5;
    }
    local_968 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_970);
    local_950 = &local_940;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_940 = *puVar6;
      lStack_938 = puVar5[3];
    }
    else {
      local_940 = *puVar6;
      local_950 = (ulong *)*puVar5;
    }
    local_948 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_950,(ulong)local_568);
    local_930 = &local_920;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_920 = *puVar6;
      lStack_918 = puVar5[3];
    }
    else {
      local_920 = *puVar6;
      local_930 = (ulong *)*puVar5;
    }
    local_928 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_930);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_9e0 = *puVar6;
      lStack_9d8 = puVar5[3];
      local_9f0 = &local_9e0;
    }
    else {
      local_9e0 = *puVar6;
      local_9f0 = (ulong *)*puVar5;
    }
    local_9e8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_650 = &local_640;
    std::__cxx11::string::_M_construct((ulong)&local_650,cVar10);
    uVar16 = 0xf;
    if (local_9f0 != &local_9e0) {
      uVar16 = local_9e0;
    }
    if (uVar16 < (ulong)(local_648 + local_9e8)) {
      uVar16 = 0xf;
      if (local_650 != &local_640) {
        uVar16 = local_640;
      }
      if (uVar16 < (ulong)(local_648 + local_9e8)) goto LAB_00270b88;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_650,0,(char *)0x0,(ulong)local_9f0);
    }
    else {
LAB_00270b88:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9f0,(ulong)local_650);
    }
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_880 = *plVar4;
      lStack_878 = puVar5[3];
      local_890 = &local_880;
    }
    else {
      local_880 = *plVar4;
      local_890 = (long *)*puVar5;
    }
    local_888 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_890);
    local_9d0 = &local_9c0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_9c0 = *puVar6;
      lStack_9b8 = puVar5[3];
    }
    else {
      local_9c0 = *puVar6;
      local_9d0 = (ulong *)*puVar5;
    }
    local_9c8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_5c8 = &local_5b8;
    std::__cxx11::string::_M_construct((ulong)&local_5c8,cVar12);
    uVar16 = 0xf;
    if (local_9d0 != &local_9c0) {
      uVar16 = local_9c0;
    }
    if (uVar16 < (ulong)(local_5c0 + local_9c8)) {
      uVar16 = 0xf;
      if (local_5c8 != &local_5b8) {
        uVar16 = local_5b8;
      }
      if (uVar16 < (ulong)(local_5c0 + local_9c8)) goto LAB_00270cc5;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_5c8,0,(char *)0x0,(ulong)local_9d0);
    }
    else {
LAB_00270cc5:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9d0,(ulong)local_5c8);
    }
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_9a0 = *plVar4;
      lStack_998 = puVar5[3];
      local_9b0 = &local_9a0;
    }
    else {
      local_9a0 = *plVar4;
      local_9b0 = (long *)*puVar5;
    }
    local_9a8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_9b0);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_6c0 = *puVar6;
      lStack_6b8 = puVar5[3];
      local_6d0 = &local_6c0;
    }
    else {
      local_6c0 = *puVar6;
      local_6d0 = (ulong *)*puVar5;
    }
    local_6c8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_5e8,(string *)&local_6d0);
    if (local_6d0 != &local_6c0) {
      operator_delete(local_6d0);
    }
    if (local_9b0 != &local_9a0) {
      operator_delete(local_9b0);
    }
    if (local_5c8 != &local_5b8) {
      operator_delete(local_5c8);
    }
    if (local_9d0 != &local_9c0) {
      operator_delete(local_9d0);
    }
    if (local_890 != &local_880) {
      operator_delete(local_890);
    }
    sVar7 = local_148;
    if (local_650 != &local_640) {
      operator_delete(local_650);
    }
    if (local_9f0 != &local_9e0) {
      operator_delete(local_9f0);
    }
    if (local_930 != &local_920) {
      operator_delete(local_930);
    }
    if (local_950 != &local_940) {
      operator_delete(local_950);
    }
    if (local_970 != &local_960) {
      operator_delete(local_970);
    }
    if (local_5a8 != &local_598) {
      operator_delete(local_5a8);
    }
    if (local_990 != &local_980) {
      operator_delete(local_990);
    }
    if (local_8d0 != &local_8c0) {
      operator_delete(local_8d0);
    }
    if (local_910 != &local_900) {
      operator_delete(local_910);
    }
    if (local_870 != &local_860) {
      operator_delete(local_870);
    }
    if (local_6f0 != &local_6e0) {
      operator_delete(local_6f0);
    }
    if (local_830 != &local_820) {
      operator_delete(local_830);
    }
    if (local_850 != &local_840) {
      operator_delete(local_850);
    }
    if (local_730 != &local_720) {
      operator_delete(local_730);
    }
    if (local_810 != &local_800) {
      operator_delete(local_810);
    }
    if (local_690 != &local_680) {
      operator_delete(local_690);
    }
    if (local_670 != &local_660) {
      operator_delete(local_670);
    }
    if (local_710 != &local_700) {
      operator_delete(local_710);
    }
    if (local_630 != &local_620) {
      operator_delete(local_630);
    }
    if (local_6b0 != &local_6a0) {
      operator_delete(local_6b0);
    }
    if (local_7b0 != &local_7a0) {
      operator_delete(local_7b0);
    }
    if (local_588 != &local_578) {
      operator_delete(local_588);
    }
    if (local_7d0 != &local_7c0) {
      operator_delete(local_7d0);
    }
    if (local_608 != &local_5f8) {
      operator_delete(local_608);
    }
    if (local_750 != &local_740) {
      operator_delete(local_750);
    }
    if (local_8b0 != &local_8a0) {
      operator_delete(local_8b0);
    }
    if (local_8f0 != &local_8e0) {
      operator_delete(local_8f0);
    }
    if (local_770 != &local_760) {
      operator_delete(local_770);
    }
    if (local_7f0 != &local_7e0) {
      operator_delete(local_7f0);
    }
    if (local_790 != &local_780) {
      operator_delete(local_790);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428);
    }
    if (local_448 != &local_438) {
      operator_delete(local_448);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468);
    }
    puVar6 = &local_3b8;
    puVar14 = local_3c8;
  }
  if (puVar14 != puVar6) {
    operator_delete(puVar14);
  }
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,cVar12);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_248 = &local_238;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_238 = *puVar6;
    lStack_230 = plVar4[3];
  }
  else {
    local_238 = *puVar6;
    local_248 = (ulong *)*plVar4;
  }
  local_240 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_248,(ulong)(attr_name->_M_dataplus)._M_p);
  local_228 = &local_218;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_218 = *puVar6;
    lStack_210 = plVar4[3];
  }
  else {
    local_218 = *puVar6;
    local_228 = (ulong *)*plVar4;
  }
  local_220 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_208 = &local_1f8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1f8 = *puVar6;
    lStack_1f0 = plVar4[3];
  }
  else {
    local_1f8 = *puVar6;
    local_208 = (ulong *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)(rel_name->_M_dataplus)._M_p);
  local_1e8 = &local_1d8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1d8 = *puVar6;
    lStack_1d0 = plVar4[3];
  }
  else {
    local_1d8 = *puVar6;
    local_1e8 = (ulong *)*plVar4;
  }
  local_1e0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_408 = &local_3f8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_3f8 = *puVar6;
    uStack_3f0 = (undefined4)plVar4[3];
    uStack_3ec = *(undefined4 *)((long)plVar4 + 0x1c);
  }
  else {
    local_3f8 = *puVar6;
    local_408 = (ulong *)*plVar4;
  }
  local_400 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pCVar13 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pCVar13,
             (pointer)((long)&(pCVar13->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_268,pCVar13,&local_90,sVar7,SUB41(local_13c,0));
  uVar16 = 0xf;
  if (local_408 != &local_3f8) {
    uVar16 = local_3f8;
  }
  if (uVar16 < local_268._M_string_length + local_400) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      uVar15 = local_268.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_268._M_string_length + local_400) goto LAB_0027143b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_408);
  }
  else {
LAB_0027143b:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_268._M_dataplus._M_p);
  }
  local_4e8 = &local_4d8;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_4d8 = *puVar6;
    uStack_4d0 = puVar5[3];
  }
  else {
    local_4d8 = *puVar6;
    local_4e8 = (ulong *)*puVar5;
  }
  local_4e0 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4e8);
  local_1c8 = &local_1b8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1b8 = *puVar6;
    lStack_1b0 = plVar4[3];
  }
  else {
    local_1b8 = *puVar6;
    local_1c8 = (ulong *)*plVar4;
  }
  local_1c0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1c8,(ulong)(attr_name->_M_dataplus)._M_p);
  local_1a8 = &local_198;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_198 = *puVar6;
    lStack_190 = plVar4[3];
  }
  else {
    local_198 = *puVar6;
    local_1a8 = (ulong *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_3e8 = &local_3d8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_3d8 = *puVar6;
    lStack_3d0 = plVar4[3];
  }
  else {
    local_3d8 = *puVar6;
    local_3e8 = (ulong *)*plVar4;
  }
  local_3e0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct((ulong)&local_308,cVar12);
  uVar16 = 0xf;
  if (local_3e8 != &local_3d8) {
    uVar16 = local_3d8;
  }
  if (uVar16 < (ulong)(local_300 + local_3e0)) {
    uVar16 = 0xf;
    if (local_308 != local_2f8) {
      uVar16 = local_2f8[0];
    }
    if (uVar16 < (ulong)(local_300 + local_3e0)) goto LAB_00271667;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_3e8);
  }
  else {
LAB_00271667:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_308);
  }
  local_2e8 = &local_2d8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_2d8 = *puVar1;
    uStack_2d0 = puVar5[3];
  }
  else {
    local_2d8 = *puVar1;
    local_2e8 = (undefined8 *)*puVar5;
  }
  local_2e0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_548 = &local_538;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_538 = *puVar6;
    lStack_530 = plVar4[3];
  }
  else {
    local_538 = *puVar6;
    local_548 = (ulong *)*plVar4;
  }
  local_540 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_328 = local_318;
  std::__cxx11::string::_M_construct((ulong)&local_328,cVar10);
  uVar16 = 0xf;
  if (local_548 != &local_538) {
    uVar16 = local_538;
  }
  if (uVar16 < (ulong)(local_320 + local_540)) {
    uVar16 = 0xf;
    if (local_328 != local_318) {
      uVar16 = local_318[0];
    }
    if (uVar16 < (ulong)(local_320 + local_540)) goto LAB_002717c9;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)local_548);
  }
  else {
LAB_002717c9:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_548,(ulong)local_328);
  }
  local_4c8 = &local_4b8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_4b8 = *puVar1;
    uStack_4b0 = puVar5[3];
  }
  else {
    local_4b8 = *puVar1;
    local_4c8 = (undefined8 *)*puVar5;
  }
  local_4c0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  local_2c8 = &local_2b8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_2b8 = *puVar6;
    lStack_2b0 = plVar4[3];
  }
  else {
    local_2b8 = *puVar6;
    local_2c8 = (ulong *)*plVar4;
  }
  local_2c0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_568);
  local_188 = &local_178;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_178 = *plVar8;
    lStack_170 = plVar4[3];
  }
  else {
    local_178 = *plVar8;
    local_188 = (long *)*plVar4;
  }
  local_180 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_2a8 = &local_298;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_298 = *puVar6;
    lStack_290 = plVar4[3];
  }
  else {
    local_298 = *puVar6;
    local_2a8 = (ulong *)*plVar4;
  }
  local_2a0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_348 = local_338;
  std::__cxx11::string::_M_construct((ulong)&local_348,cVar10);
  uVar16 = 0xf;
  if (local_2a8 != &local_298) {
    uVar16 = local_298;
  }
  if (uVar16 < (ulong)(local_340 + local_2a0)) {
    uVar16 = 0xf;
    if (local_348 != local_338) {
      uVar16 = local_338[0];
    }
    if (uVar16 < (ulong)(local_340 + local_2a0)) goto LAB_002719fe;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_002719fe:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_348);
  }
  local_3a8 = &local_398;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_398 = *plVar4;
    lStack_390 = puVar5[3];
  }
  else {
    local_398 = *plVar4;
    local_3a8 = (long *)*puVar5;
  }
  local_3a0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_528 = &local_518;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_518 = *puVar6;
    lStack_510 = plVar4[3];
  }
  else {
    local_518 = *puVar6;
    local_528 = (ulong *)*plVar4;
  }
  local_520 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_368 = local_358;
  std::__cxx11::string::_M_construct((ulong)&local_368,cVar12);
  uVar16 = 0xf;
  if (local_528 != &local_518) {
    uVar16 = local_518;
  }
  if (uVar16 < (ulong)(local_360 + local_520)) {
    uVar16 = 0xf;
    if (local_368 != local_358) {
      uVar16 = local_358[0];
    }
    if (uVar16 < (ulong)(local_360 + local_520)) goto LAB_00271b60;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_528);
  }
  else {
LAB_00271b60:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_368);
  }
  local_4a8 = &local_498;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_498 = *puVar1;
    uStack_490 = puVar5[3];
  }
  else {
    local_498 = *puVar1;
    local_4a8 = (undefined8 *)*puVar5;
  }
  local_4a0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  local_508 = &local_4f8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_4f8 = *puVar6;
    lStack_4f0 = plVar4[3];
  }
  else {
    local_4f8 = *puVar6;
    local_508 = (ulong *)*plVar4;
  }
  local_500 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_388 = local_378;
  std::__cxx11::string::_M_construct((ulong)&local_388,cVar12);
  uVar16 = 0xf;
  if (local_508 != &local_4f8) {
    uVar16 = local_4f8;
  }
  if (uVar16 < (ulong)(local_380 + local_500)) {
    uVar16 = 0xf;
    if (local_388 != local_378) {
      uVar16 = local_378[0];
    }
    if (uVar16 < (ulong)(local_380 + local_500)) goto LAB_00271cc2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_508);
  }
  else {
LAB_00271cc2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_508,(ulong)local_388);
  }
  local_488 = &local_478;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_478 = *puVar1;
    uStack_470 = puVar5[3];
  }
  else {
    local_478 = *puVar1;
    local_488 = (undefined8 *)*puVar5;
  }
  local_480 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_488);
  local_288 = &local_278;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_278 = *puVar6;
    lStack_270 = plVar4[3];
  }
  else {
    local_278 = *puVar6;
    local_288 = (ulong *)*plVar4;
  }
  local_280 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_288,(ulong)(attr_name->_M_dataplus)._M_p);
  local_5c8 = &local_5b8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_5b8 = *puVar6;
    lStack_5b0 = plVar4[3];
  }
  else {
    local_5b8 = *puVar6;
    local_5c8 = (ulong *)*plVar4;
  }
  local_5c0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5c8);
  local_650 = &local_640;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_640 = *puVar6;
    lStack_638 = plVar4[3];
  }
  else {
    local_640 = *puVar6;
    local_650 = (ulong *)*plVar4;
  }
  local_648 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_650,(ulong)(rel_name->_M_dataplus)._M_p);
  local_5a8 = &local_598;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_598 = *puVar6;
    lStack_590 = plVar4[3];
  }
  else {
    local_598 = *puVar6;
    local_5a8 = (ulong *)*plVar4;
  }
  local_5a0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_630 = &local_620;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_620 = *puVar6;
    lStack_618 = plVar4[3];
  }
  else {
    local_620 = *puVar6;
    local_630 = (ulong *)*plVar4;
  }
  local_628 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_630,(ulong)(rel_name->_M_dataplus)._M_p);
  local_588 = &local_578;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_578 = *puVar6;
    lStack_570 = plVar4[3];
  }
  else {
    local_578 = *puVar6;
    local_588 = (ulong *)*plVar4;
  }
  local_580 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_588);
  local_3c8 = &local_3b8;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_3b8 = *puVar6;
    lStack_3b0 = plVar4[3];
  }
  else {
    local_3b8 = *puVar6;
    local_3c8 = (ulong *)*plVar4;
  }
  local_3c0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_568);
  local_468 = &local_458;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_458 = *plVar8;
    lStack_450 = plVar4[3];
  }
  else {
    local_458 = *plVar8;
    local_468 = (long *)*plVar4;
  }
  local_460 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_468);
  local_448 = &local_438;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_438 = *plVar8;
    lStack_430 = plVar4[3];
  }
  else {
    local_438 = *plVar8;
    local_448 = (long *)*plVar4;
  }
  local_440 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_448,(ulong)(attr_name->_M_dataplus)._M_p);
  local_428 = &local_418;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_418 = *plVar8;
    lStack_410 = plVar4[3];
  }
  else {
    local_418 = *plVar8;
    local_428 = (long *)*plVar4;
  }
  local_420 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_428);
  local_790 = &local_780;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_780 = *puVar6;
    lStack_778 = plVar4[3];
  }
  else {
    local_780 = *puVar6;
    local_790 = (ulong *)*plVar4;
  }
  local_788 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar12);
  uVar16 = 0xf;
  if (local_790 != &local_780) {
    uVar16 = local_780;
  }
  if (uVar16 < (ulong)(local_a8 + local_788)) {
    uVar16 = 0xf;
    if (local_b0 != local_a0) {
      uVar16 = local_a0[0];
    }
    if (uVar16 < (ulong)(local_a8 + local_788)) goto LAB_00272218;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_790);
  }
  else {
LAB_00272218:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_790,(ulong)local_b0);
  }
  local_7f0 = &local_7e0;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_7e0 = *puVar6;
    lStack_7d8 = puVar5[3];
  }
  else {
    local_7e0 = *puVar6;
    local_7f0 = (ulong *)*puVar5;
  }
  local_7e8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7f0);
  local_770 = &local_760;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_760 = *puVar6;
    lStack_758 = plVar4[3];
  }
  else {
    local_760 = *puVar6;
    local_770 = (ulong *)*plVar4;
  }
  local_768 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_770,(ulong)local_130);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_8e0 = *puVar6;
    lStack_8d8 = plVar4[3];
    local_8f0 = &local_8e0;
  }
  else {
    local_8e0 = *puVar6;
    local_8f0 = (ulong *)*plVar4;
  }
  local_8e8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,cVar10);
  uVar16 = 0xf;
  if (local_8f0 != &local_8e0) {
    uVar16 = local_8e0;
  }
  if (uVar16 < (ulong)(local_108 + local_8e8)) {
    uVar16 = 0xf;
    if (local_110 != local_100) {
      uVar16 = local_100[0];
    }
    if (uVar16 < (ulong)(local_108 + local_8e8)) goto LAB_002723e9;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_8f0);
  }
  else {
LAB_002723e9:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8f0,(ulong)local_110);
  }
  local_8b0 = &local_8a0;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_8a0 = *puVar6;
    lStack_898 = puVar5[3];
  }
  else {
    local_8a0 = *puVar6;
    local_8b0 = (ulong *)*puVar5;
  }
  local_8a8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_8b0);
  local_750 = &local_740;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_740 = *puVar6;
    lStack_738 = plVar4[3];
  }
  else {
    local_740 = *puVar6;
    local_750 = (ulong *)*plVar4;
  }
  local_748 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_750,(ulong)(attr_name->_M_dataplus)._M_p);
  local_608 = &local_5f8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_5f8 = *plVar8;
    lStack_5f0 = plVar4[3];
  }
  else {
    local_5f8 = *plVar8;
    local_608 = (long *)*plVar4;
  }
  local_600 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_608);
  local_7d0 = &local_7c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_7c0 = *puVar6;
    lStack_7b8 = plVar4[3];
  }
  else {
    local_7c0 = *puVar6;
    local_7d0 = (ulong *)*plVar4;
  }
  local_7c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_7d0,(ulong)(rel_name->_M_dataplus)._M_p);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_7a0 = *plVar8;
    lStack_798 = plVar4[3];
    local_7b0 = &local_7a0;
  }
  else {
    local_7a0 = *plVar8;
    local_7b0 = (long *)*plVar4;
  }
  local_7a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b0);
  local_6b0 = &local_6a0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_6a0 = *puVar6;
    lStack_698 = plVar4[3];
  }
  else {
    local_6a0 = *puVar6;
    local_6b0 = (ulong *)*plVar4;
  }
  local_6a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6b0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_710 = &local_700;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_700 = *plVar8;
    lStack_6f8 = plVar4[3];
  }
  else {
    local_700 = *plVar8;
    local_710 = (long *)*plVar4;
  }
  local_708 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_710);
  local_670 = &local_660;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_660 = *plVar8;
    lStack_658 = plVar4[3];
  }
  else {
    local_660 = *plVar8;
    local_670 = (long *)*plVar4;
  }
  local_668 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_670,(ulong)local_568);
  local_690 = &local_680;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_680 = *puVar6;
    lStack_678 = plVar4[3];
  }
  else {
    local_680 = *puVar6;
    local_690 = (ulong *)*plVar4;
  }
  local_688 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_690);
  local_810 = &local_800;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_800 = *puVar6;
    lStack_7f8 = plVar4[3];
  }
  else {
    local_800 = *puVar6;
    local_810 = (ulong *)*plVar4;
  }
  local_808 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_810,(ulong)(attr_name->_M_dataplus)._M_p);
  local_730 = &local_720;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_720 = *puVar6;
    lStack_718 = plVar4[3];
  }
  else {
    local_720 = *puVar6;
    local_730 = (ulong *)*plVar4;
  }
  local_728 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_730);
  local_850 = &local_840;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_840 = *puVar6;
    lStack_838 = plVar4[3];
  }
  else {
    local_840 = *puVar6;
    local_850 = (ulong *)*plVar4;
  }
  local_848 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)local_610);
  uVar16 = 0xf;
  if (local_850 != &local_840) {
    uVar16 = local_840;
  }
  if (uVar16 < (ulong)(local_c8 + local_848)) {
    uVar16 = 0xf;
    if (local_d0 != local_c0) {
      uVar16 = local_c0[0];
    }
    if (uVar16 < (ulong)(local_c8 + local_848)) goto LAB_00272949;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_850);
  }
  else {
LAB_00272949:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_850,(ulong)local_d0);
  }
  local_830 = &local_820;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_820 = *puVar6;
    lStack_818 = puVar5[3];
  }
  else {
    local_820 = *puVar6;
    local_830 = (ulong *)*puVar5;
  }
  local_828 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_830);
  local_6f0 = &local_6e0;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_6e0 = *plVar8;
    lStack_6d8 = plVar4[3];
  }
  else {
    local_6e0 = *plVar8;
    local_6f0 = (long *)*plVar4;
  }
  local_6e8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6f0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_870 = &local_860;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_860 = *puVar6;
    lStack_858 = plVar4[3];
  }
  else {
    local_860 = *puVar6;
    local_870 = (ulong *)*plVar4;
  }
  local_868 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_870);
  local_910 = &local_900;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_900 = *plVar8;
    lStack_8f8 = plVar4[3];
  }
  else {
    local_900 = *plVar8;
    local_910 = (long *)*plVar4;
  }
  local_908 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_910,(ulong)(rel_name->_M_dataplus)._M_p);
  local_8d0 = &local_8c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_8c0 = *puVar6;
    lStack_8b8 = plVar4[3];
  }
  else {
    local_8c0 = *puVar6;
    local_8d0 = (ulong *)*plVar4;
  }
  local_8c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_8d0);
  local_990 = &local_980;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_980 = *puVar6;
    lStack_978 = plVar4[3];
  }
  else {
    local_980 = *puVar6;
    local_990 = (ulong *)*plVar4;
  }
  local_988 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_990,(ulong)(rel_name->_M_dataplus)._M_p);
  local_970 = &local_960;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_960 = *puVar6;
    lStack_958 = plVar4[3];
  }
  else {
    local_960 = *puVar6;
    local_970 = (ulong *)*plVar4;
  }
  local_968 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_970);
  local_950 = &local_940;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_940 = *puVar6;
    lStack_938 = plVar4[3];
  }
  else {
    local_940 = *puVar6;
    local_950 = (ulong *)*plVar4;
  }
  local_948 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_950,(ulong)local_568);
  local_930 = &local_920;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_920 = *puVar6;
    lStack_918 = plVar4[3];
  }
  else {
    local_920 = *puVar6;
    local_930 = (ulong *)*plVar4;
  }
  local_928 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_930);
  local_9f0 = &local_9e0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_9e0 = *puVar6;
    lStack_9d8 = plVar4[3];
  }
  else {
    local_9e0 = *puVar6;
    local_9f0 = (ulong *)*plVar4;
  }
  local_9e8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_9f0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_890 = &local_880;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_880 = *plVar8;
    lStack_878 = plVar4[3];
  }
  else {
    local_880 = *plVar8;
    local_890 = (long *)*plVar4;
  }
  local_888 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_890);
  local_9d0 = &local_9c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_9c0 = *puVar6;
    lStack_9b8 = plVar4[3];
  }
  else {
    local_9c0 = *puVar6;
    local_9d0 = (ulong *)*plVar4;
  }
  local_9c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar12);
  uVar16 = 0xf;
  if (local_9d0 != &local_9c0) {
    uVar16 = local_9c0;
  }
  if (uVar16 < (ulong)(local_e8 + local_9c8)) {
    uVar16 = 0xf;
    if (local_f0 != local_e0) {
      uVar16 = local_e0[0];
    }
    if ((ulong)(local_e8 + local_9c8) <= uVar16) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_9d0);
      goto LAB_00272e8b;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9d0,(ulong)local_f0);
LAB_00272e8b:
  local_9b0 = &local_9a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_9a0 = *plVar4;
    lStack_998 = puVar5[3];
  }
  else {
    local_9a0 = *plVar4;
    local_9b0 = (long *)*puVar5;
  }
  local_9a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_9b0);
  local_6d0 = &local_6c0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_6c0 = *puVar6;
    lStack_6b8 = plVar4[3];
  }
  else {
    local_6c0 = *puVar6;
    local_6d0 = (ulong *)*plVar4;
  }
  local_6c8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_6d0,(ulong)local_5e8);
  (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    lVar3 = plVar4[3];
    (local_138->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&local_138->field_2 + 8) = lVar3;
  }
  else {
    (local_138->_M_dataplus)._M_p = (pointer)*plVar4;
    (local_138->field_2)._M_allocated_capacity = *psVar9;
  }
  local_138->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_6d0 != &local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890);
  }
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_850 != &local_840) {
    operator_delete(local_850);
  }
  if (local_730 != &local_720) {
    operator_delete(local_730);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810);
  }
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670);
  }
  if (local_710 != &local_700) {
    operator_delete(local_710);
  }
  if (local_6b0 != &local_6a0) {
    operator_delete(local_6b0);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0);
  }
  if (local_770 != &local_760) {
    operator_delete(local_770);
  }
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_790 != &local_780) {
    operator_delete(local_790);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588);
  }
  if (local_630 != &local_620) {
    operator_delete(local_630);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8);
  }
  if (local_650 != &local_640) {
    operator_delete(local_650);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_568 != local_558) {
    operator_delete(local_568);
  }
  return local_138;
}

Assistant:

std::string CppGenerator::seekValueGenericJoin(
    size_t depth, const std::string& rel_name, const std::string& attr_name,
    bool parallel, bool firstFactor)
{
    const std::string depthString = std::to_string(depth);
    const std::string upperPointer = getUpperPointer(rel_name,depth,parallel);
    
    std::string findUpperBound = 
        offset(5+depth)+"leap = 1;\n"+
        offset(5+depth)+"high = lowerptr_"+rel_name+"["+depthString+"];\n"+
        offset(5+depth)+"while (high <= "+
        upperPointer+" && "+rel_name+"[high]."+attr_name+" < max_"+attr_name+")\n"+
        offset(5+depth)+"{\n"+
        offset(6+depth)+"high += leap;\n"+
        offset(6+depth)+"leap *= 2;\n"+
        offset(5+depth)+"}\n";

    /*
     * When we found an upper bound; to find the least upper bound;
     * use binary search to backtrack.
     */ 
    findUpperBound += offset(5+depth)+"/* Backtrack with binary search */\n"+
        // offset(6+depth)+"if (leap > 2 && max_"+attr_name+" <= "+rel_name+
        // "[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"
        // +offset(6+depth)+"{\n"+
        offset(5+depth)+"leap /= 2;\n"+
        offset(5+depth)+"high = std::min(high,"+upperPointer+");\n"+
        offset(5+depth)+"low = high - leap; mid = 0;\n"+
        offset(5+depth)+"while (low <= high)\n"+
        offset(5+depth)+"{\n"+
        offset(6+depth)+"mid = (high + low) / 2;\n"+
        // offset(8+depth)+"if(max_"+attr_name+" == "+rel_name+"[mid]."+attr_name+")\n"+
        // offset(8+depth)+"{\n"+
        // offset(9+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        // offset(9+depth)+"high = mid - 1;\n"+
        // offset(8+depth)+"}\n"+
        offset(6+depth)+"if (max_"+attr_name+" < "+rel_name+"[mid]."+attr_name+")\n"+
        offset(7+depth)+"high = mid - 1;\n"+
        offset(6+depth)+"else if(max_"+attr_name+" > "+rel_name+"[mid]."+attr_name+")\n"+
        offset(7+depth)+"low = mid + 1;\n"+
        offset(6+depth)+"else if  (low != mid)\n"+offset(7+depth)+"high = mid;\n"+
        offset(6+depth)+"else\n"+offset(7+depth)+"break;\n"+
        offset(5+depth)+"}\n"+
        // offset(7+depth)+"mid = (high + low) / 2;\n"+
        // offset(5+depth)+"if("+rel_name+"[mid-1]."+attr_name+">=max_"+attr_name+")\n"+
        // offset(6+depth)+"std::cout << \"ERROR : "+rel_name+"[mid-1]."+
        // attr_name+" >= max_"+attr_name+"\\n\";\n"+
        // offset(5+depth)+"if("+rel_name+"[mid]."+attr_name+"<max_"+attr_name+")\n"+
        // offset(6+depth)+"std::cout << \"ERROR : "+rel_name+"[mid]."+
        // attr_name+" < max_"+attr_name+"\\n\";\n"+
        offset(5+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n";
        // offset(6+depth)+"}\n";

    std::string resetMaxVal = "";
    if (firstFactor)
    {
        resetMaxVal = offset(4+depth)+"max_"+attr_name+" = "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+";\n";
    }
    else
    {
        resetMaxVal = offset(4+depth)+"if (max_"+attr_name+" < "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"+
            offset(4+depth)+"{\n"+offset(5+depth)+"max_"+attr_name+" = "+
            rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+";\n"+
            offset(5+depth)+"found["+depthString+"] = false;\n"+
            offset(5+depth)+"continue;\n"+
            offset(4+depth)+"}\n";
    }
    
    
    return /*offset(4+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(5+depth)+"found["+depthString+"] = true;\n"+*/
        // else if 
        offset(4+depth)+"if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(4+depth)+"{\n"+offset(5+depth)+"atEnd["+depthString+"] = true;\n"+
        offset(5+depth)+"break;\n"+offset(4+depth)+"}\n"+
        //else 
        offset(4+depth)+"else if (max_"+attr_name+" > "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+")\n"+
        offset(4+depth)+"{\n"+findUpperBound+
        offset(5+depth)+"if (max_"+attr_name+" > "+rel_name+"[lowerptr_"+
        rel_name+"["+depthString+"]]."+attr_name+")\n"+
        offset(6+depth)+"std::cout << \"ERROR: max_"+attr_name+" > "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attr_name+"\\n\";\n"+
        offset(4+depth)+"}\n"+
        resetMaxVal;
}